

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  string *extraout_RAX;
  ExceptionTranslatorRegistry *pEStack_b0;
  string *psStack_a8;
  undefined1 *puStack_a0;
  string *local_70;
  string *local_68;
  ExceptionTranslatorRegistry *local_60;
  exception *ex;
  string *msg;
  char *msg_1;
  ExceptionTranslatorRegistry *local_18;
  ExceptionTranslatorRegistry *this_local;
  
  puStack_a0 = (undefined1 *)0x172b0b;
  local_70 = __return_storage_ptr__;
  local_68 = __return_storage_ptr__;
  local_60 = this;
  local_18 = this;
  this_local = (ExceptionTranslatorRegistry *)__return_storage_ptr__;
  __cxa_rethrow();
  pEStack_b0 = this;
  psStack_a8 = __return_storage_ptr__;
  puStack_a0 = &stack0xfffffffffffffff8;
  std::
  vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ::push_back((vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
               *)&__return_storage_ptr__->_M_string_length,(value_type *)&pEStack_b0);
  return extraout_RAX;
}

Assistant:

virtual std::string translateActiveException() const {
            try {
#ifdef __OBJC__
                // In Objective-C try objective-c exceptions first
                @try {
                    throw;
                }
                @catch (NSException *exception) {
                    return toString( [exception description] );
                }
#else
                throw;
#endif
            }
            catch( std::exception& ex ) {
                return ex.what();
            }
            catch( std::string& msg ) {
                return msg;
            }
            catch( const char* msg ) {
                return msg;
            }
            catch(...) {
                return tryTranslators( m_translators.begin() );
            }
        }